

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O3

idx_t __thiscall
duckdb::ColumnReader::ReadInternal
          (ColumnReader *this,uint64_t num_values,data_ptr_t define_out,data_ptr_t repeat_out,
          Vector *result)

{
  ulong read_now;
  idx_t result_offset;
  uint64_t uVar1;
  
  if (num_values != 0) {
    result_offset = 0;
    uVar1 = num_values;
    do {
      while (read_now = this->page_rows_available, read_now == 0) {
        PrepareRead(this,(optional_ptr<const_duckdb::TableFilter,_true>)0x0,
                    (optional_ptr<duckdb::TableFilterState,_true>)0x0);
      }
      if (uVar1 < read_now) {
        read_now = uVar1;
      }
      if (0x7ff < read_now) {
        read_now = 0x800;
      }
      ReadData(this,read_now,define_out,repeat_out,result,result_offset);
      result_offset = result_offset + read_now;
      uVar1 = uVar1 - read_now;
    } while (uVar1 != 0);
  }
  FinishRead(this,num_values);
  return num_values;
}

Assistant:

idx_t ColumnReader::ReadInternal(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out, Vector &result) {
	idx_t result_offset = 0;
	auto to_read = num_values;
	D_ASSERT(to_read <= STANDARD_VECTOR_SIZE);

	while (to_read > 0) {
		auto read_now = ReadPageHeaders(to_read);

		ReadData(read_now, define_out, repeat_out, result, result_offset);

		result_offset += read_now;
		to_read -= read_now;
	}
	FinishRead(num_values);

	return num_values;
}